

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::modPow(SVInt *this,SVInt *base,SVInt *exponent,bool bothSigned)

{
  SVInt *pSVar1;
  SVInt *pSVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  uint32_t i;
  ulong uVar4;
  uint64_t uVar5;
  int iVar6;
  bool bVar7;
  SVInt SVar8;
  SVInt baseCopy;
  anon_class_8_1_f62ae5da mulReduce;
  TempBuffer<unsigned_long,_128UL> scratch;
  
  TempBuffer<unsigned_long,_128UL>::TempBuffer
            (&scratch,(ulong)((base->super_SVIntStorage).bitWidth * 2 + 0x3f >> 6));
  SVInt(&baseCopy,&base->super_SVIntStorage);
  SVInt(this,(base->super_SVIntStorage).bitWidth,1,false);
  uVar3 = (ulong)((((exponent->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
                  ((exponent->super_SVIntStorage).unknownFlag & 0x1fU)) - 1);
  uVar4 = 0;
  mulReduce.scratch = &scratch;
  while( true ) {
    pSVar1 = (SVInt *)(exponent->super_SVIntStorage).field_0.val;
    pSVar2 = exponent;
    if (((exponent->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar2 = pSVar1;
    }
    if (0x40 < (exponent->super_SVIntStorage).bitWidth) {
      pSVar2 = pSVar1;
    }
    if (uVar4 == uVar3) break;
    uVar5 = (&(pSVar2->super_SVIntStorage).field_0)[uVar4].val;
    iVar6 = 0x40;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      if ((uVar5 & 1) != 0) {
        modPow::anon_class_8_1_f62ae5da::operator()(&mulReduce,this,&baseCopy,this);
      }
      modPow::anon_class_8_1_f62ae5da::operator()(&mulReduce,&baseCopy,&baseCopy,&baseCopy);
      uVar5 = uVar5 >> 1;
    }
    uVar4 = uVar4 + 1;
  }
  for (uVar5 = (&(pSVar2->super_SVIntStorage).field_0)[uVar3].val; uVar5 != 0; uVar5 = uVar5 >> 1) {
    if ((uVar5 & 1) != 0) {
      modPow::anon_class_8_1_f62ae5da::operator()(&mulReduce,this,&baseCopy,this);
    }
    if (uVar5 != 1) {
      modPow::anon_class_8_1_f62ae5da::operator()(&mulReduce,&baseCopy,&baseCopy,&baseCopy);
    }
  }
  (this->super_SVIntStorage).signFlag = bothSigned;
  ~SVInt(&baseCopy);
  TempBuffer<unsigned_long,_128UL>::~TempBuffer(&scratch);
  SVar8.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar8.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar8.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar8.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar8.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar8.super_SVIntStorage;
}

Assistant:

SVInt SVInt::modPow(const SVInt& base, const SVInt& exponent, bool bothSigned) {
    // This is based on the modular exponentiation algorithm described here:
    // https://en.wikipedia.org/wiki/Modular_exponentiation
    //
    // The result value will have the same bit width as the lhs. That's the value we'll
    // be using as the modulus in the (a * b) mod m equation.
    // Allocate a temporary scratch buffer that has 2x the number of bits so that we can
    // handle any possible intermediate multiply.
    TempBuffer<uint64_t, 128> scratch(getNumWords(base.bitWidth * 2, false));
    SVInt baseCopy = base;
    SVInt result(base.bitWidth, 1, false);

    auto mulReduce = [&](const SVInt& left, const SVInt& right, SVInt& result) {
        bitwidth_t lhsBits = left.getActiveBits();
        bitwidth_t rhsBits = right.getActiveBits();
        uint32_t lhsWords = !lhsBits ? 0 : whichWord(lhsBits - 1) + 1;
        uint32_t rhsWords = !rhsBits ? 0 : whichWord(rhsBits - 1) + 1;

        scratch.fill(0);
        mul(scratch.get(), left.getRawData(), lhsWords, right.getRawData(), rhsWords);

        uint32_t destWords = lhsWords + rhsWords;
        if (destWords >= result.getNumWords()) {
            memcpy(result.getRawData(), scratch.get(), result.getNumWords() * sizeof(uint64_t));
            result.clearUnusedBits();
        }
        else {
            memcpy(result.getRawData(), scratch.get(), destWords * sizeof(uint64_t));
            result.clearUnusedBits();
        }
    };

    // Loop through each bit of the exponent.
    uint32_t exponentWords = exponent.getNumWords();
    for (uint32_t i = 0; i < exponentWords - 1; i++) {
        uint64_t word = exponent.getRawData()[i];
        for (int j = 0; j < BITS_PER_WORD; j++) {
            if (word & 0x1)
                mulReduce(result, baseCopy, result);
            mulReduce(baseCopy, baseCopy, baseCopy);
            word >>= 1;
        }
    }

    // Unroll the last loop iteration to avoid multiplications
    // when the rest of the exponent bits are zero
    uint64_t word = exponent.getRawData()[exponentWords - 1];
    while (word) {
        if (word & 0x1)
            mulReduce(result, baseCopy, result);
        if (word != 1)
            mulReduce(baseCopy, baseCopy, baseCopy);
        word >>= 1;
    }

    result.setSigned(bothSigned);
    return result;
}